

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

char * findNextArg(poptContext con,uint argx,int delete_arg)

{
  void *pvVar1;
  int local_2c;
  char *pcStack_28;
  int i;
  char *arg;
  optionStackEntry *os;
  int delete_arg_local;
  uint argx_local;
  poptContext con_local;
  
  arg = (char *)con->os;
  os._4_4_ = argx;
  do {
    pcStack_28 = (char *)0x0;
    for (; *(int *)(arg + 0x18) == *(int *)arg && con < arg; arg = arg + -0x40) {
    }
    if ((*(int *)(arg + 0x18) == *(int *)arg) && ((poptContext)arg == con)) {
      return (char *)0x0;
    }
    if (*(long *)(arg + 8) != 0) {
      for (local_2c = *(int *)(arg + 0x18); local_2c < *(int *)arg; local_2c = local_2c + 1) {
        if ((((*(long *)(arg + 0x10) == 0) ||
             ((*(uint *)(*(long *)(arg + 0x10) + ((ulong)(long)local_2c >> 5) * 4) &
              1 << ((byte)local_2c & 0x1f)) == 0)) &&
            (**(char **)(*(long *)(arg + 8) + (long)local_2c * 8) != '-')) &&
           (os._4_4_ = os._4_4_ - 1, os._4_4_ == 0)) {
          pcStack_28 = *(char **)(*(long *)(arg + 8) + (long)local_2c * 8);
          if (delete_arg != 0) {
            if (*(long *)(arg + 0x10) == 0) {
              pvVar1 = calloc(((ulong)(long)*(int *)arg >> 5) + 1,4);
              *(void **)(arg + 0x10) = pvVar1;
            }
            if (*(long *)(arg + 0x10) != 0) {
              *(uint *)(*(long *)(arg + 0x10) + ((ulong)(long)local_2c >> 5) * 4) =
                   1 << ((byte)local_2c & 0x1f) |
                   *(uint *)(*(long *)(arg + 0x10) + ((ulong)(long)local_2c >> 5) * 4);
            }
          }
          break;
        }
      }
    }
    if (con < arg) {
      arg = arg + -0x40;
    }
    if (pcStack_28 != (char *)0x0) {
      return pcStack_28;
    }
  } while( true );
}

Assistant:

static const char * findNextArg(poptContext con,
		unsigned argx, int delete_arg)
{
    struct optionStackEntry * os = con->os;
    const char * arg;

    do {
	int i;
	arg = NULL;
	while (os->next == os->argc && os > con->optionStack) os--;
	if (os->next == os->argc && os == con->optionStack) break;
	if (os->argv != NULL)
	for (i = os->next; i < os->argc; i++) {
	    if (os->argb && PBM_ISSET(i, os->argb))
		continue;
	    if (*os->argv[i] == '-')
		continue;
	    if (--argx > 0)
		continue;
	    arg = os->argv[i];
	    if (delete_arg) {
		if (os->argb == NULL) os->argb = PBM_ALLOC(os->argc);
		if (os->argb != NULL)	/* XXX can't happen */
		    PBM_SET(i, os->argb);
	    }
	    break;
	}
	if (os > con->optionStack) os--;
    } while (arg == NULL);
    return arg;
}